

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVectorForClusteredBG.cpp
# Opt level: O0

void __thiscall
JointPolicyPureVectorForClusteredBG::StartRecursiveSoftPrintPerAgent
          (JointPolicyPureVectorForClusteredBG *this,PlanningUnitDecPOMDPDiscrete *pu,
          stringstream *ss,Index ts,Index last_ts,
          vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
          *jpolBGVec,
          vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
          *bgVec)

{
  Type *this_00;
  _func_int *p_Var1;
  long lVar2;
  uint uVar3;
  Index IVar4;
  shared_count sVar5;
  bool bVar6;
  int iVar7;
  SubClass SVar8;
  Index IVar9;
  const_reference ppJVar10;
  undefined4 extraout_var;
  size_t sVar11;
  TypeCluster *pTVar12;
  reference ppTVar13;
  ostream *poVar14;
  ulong uVar15;
  undefined8 uStackY_2c0;
  Index aIStackY_2b8 [4];
  undefined8 uStackY_2a8;
  uint auStackY_2a0 [4];
  long alStackY_290 [2];
  PlanningUnitDecPOMDPDiscrete *in_stack_fffffffffffffd88;
  BayesianGameWithClusterInfo *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  uint in_stack_fffffffffffffd9c;
  undefined8 local_260;
  undefined8 local_258;
  undefined8 local_250 [5];
  undefined8 local_228 [3];
  Index aIStack_20c [3];
  Type_AOHIndex *local_200 [18];
  undefined1 local_170 [24];
  string local_158 [32];
  string local_138;
  uint local_114;
  Index local_110;
  Index aI;
  Index ohI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> observations;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  Index aohI;
  Type_AOHIndex *t2;
  Type *t1;
  type_ci last;
  type_ci it;
  TypeCluster *tc;
  Index tI;
  Index IStack_78;
  uint local_74;
  undefined1 local_70 [4];
  Index agI;
  shared_ptr<const_BayesianGameWithClusterInfo> bg;
  JointPolicyDiscretePure *jpolBG;
  vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
  *jpolBGVec_local;
  Index last_ts_local;
  Index ts_local;
  stringstream *ss_local;
  PlanningUnitDecPOMDPDiscrete *pu_local;
  JointPolicyPureVectorForClusteredBG *this_local;
  
  ppJVar10 = std::
             vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
             ::at((vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
                   *)in_stack_fffffffffffffd90,(size_type)in_stack_fffffffffffffd88);
  bg.pn.pi_ = (sp_counted_base *)*ppJVar10;
  std::
  vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
  ::at((vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
        *)in_stack_fffffffffffffd90,(size_type)in_stack_fffffffffffffd88);
  boost::shared_ptr<const_BayesianGameWithClusterInfo>::shared_ptr
            ((shared_ptr<const_BayesianGameWithClusterInfo> *)in_stack_fffffffffffffd90,
             (shared_ptr<const_BayesianGameWithClusterInfo> *)in_stack_fffffffffffffd88);
  local_74 = 0;
  while( true ) {
    iVar7 = (*(pu->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[6])();
    if (CONCAT44(extraout_var,iVar7) <= (ulong)local_74) break;
    tc._0_4_ = 0;
    while( true ) {
      boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator->
                ((shared_ptr<const_BayesianGameWithClusterInfo> *)local_70);
      sVar11 = BayesianGameBase::GetNrTypes
                         ((BayesianGameBase *)in_stack_fffffffffffffd90,
                          (Index)((ulong)in_stack_fffffffffffffd88 >> 0x20));
      if (sVar11 <= (uint)tc) break;
      boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator->
                ((shared_ptr<const_BayesianGameWithClusterInfo> *)local_70);
      pTVar12 = BayesianGameWithClusterInfo::GetTypeCluster
                          (in_stack_fffffffffffffd90,
                           (Index)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                           (Index)in_stack_fffffffffffffd88);
      last = TypeCluster::begin((TypeCluster *)in_stack_fffffffffffffd88);
      t1 = (Type *)TypeCluster::end((TypeCluster *)in_stack_fffffffffffffd88);
      while( true ) {
        bVar6 = std::operator!=(&last,(_Self *)&t1);
        if (!bVar6) break;
        ppTVar13 = std::_Rb_tree_const_iterator<Type_*>::operator*
                             ((_Rb_tree_const_iterator<Type_*> *)0x8c9c00);
        this_00 = *ppTVar13;
        SVar8 = Type::GetSubClass(this_00);
        if (SVar8 == AOHINDEX) {
          if (this_00 == (Type *)0x0) {
            local_200[3] = (Type_AOHIndex *)0x0;
          }
          else {
            local_200[3] = (Type_AOHIndex *)
                           __dynamic_cast(this_00,&Type::typeinfo,&Type_AOHIndex::typeinfo,0);
          }
          IVar9 = Type_AOHIndex::GetAOHIndex(local_200[3]);
          lVar2 = (-0x278 - ((ulong)ts * 4 + 0xf & 0xfffffffffffffff0)) -
                  ((long)(ulong)ts * 4 + 0xfU & 0xfffffffffffffff0);
          observations.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)ts;
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar2 + 0x278) = 0x8c9d29;
          PlanningUnitMADPDiscrete::GetActionObservationHistoryArrays
                    (*(PlanningUnitMADPDiscrete **)((long)local_200 + lVar2 + 0x278),
                     *(Index *)((long)aIStack_20c + lVar2 + 0x280),
                     *(Index *)((long)aIStack_20c + lVar2 + 0x27c),
                     *(Index *)((long)aIStack_20c + lVar2 + 0x278),
                     *(Index **)((long)local_228 + lVar2 + 0x288),
                     *(Index **)((long)local_228 + lVar2 + 0x280));
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar2 + 0x278) = 0x8c9d37;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                      (&stack0xfffffffffffffd80 + lVar2 + 0x278));
          if (ts != 0) {
            *(undefined8 *)(&stack0xfffffffffffffd80 + lVar2 + 0x278) = 0x8c9d74;
            std::allocator<unsigned_int>::allocator
                      (*(allocator<unsigned_int> **)(&stack0xfffffffffffffd80 + lVar2 + 0x278));
            *(undefined8 *)(&stack0xfffffffffffffd80 + lVar2 + 0x278) = 0x8c9d95;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                        ((long)local_250 + lVar2 + 0x278),
                       *(size_type *)((long)&local_258 + lVar2 + 0x278),
                       *(value_type_conflict1 **)((long)&local_260 + lVar2 + 0x278),
                       *(allocator_type **)((long)local_250 + lVar2 + 0x260));
            *(undefined8 *)(&stack0xfffffffffffffd80 + lVar2 + 0x278) = 0x8c9daa;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                      (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                        ((long)&local_260 + lVar2 + 0x278),
                       *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                        ((long)local_250 + lVar2 + 0x260));
            *(undefined8 *)(&stack0xfffffffffffffd80 + lVar2 + 0x278) = 0x8c9db6;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                      (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                        ((long)&local_260 + lVar2 + 0x278));
            *(undefined8 *)(&stack0xfffffffffffffd80 + lVar2 + 0x278) = 0x8c9dc2;
            std::allocator<unsigned_int>::~allocator
                      (*(allocator<unsigned_int> **)(&stack0xfffffffffffffd80 + lVar2 + 0x278));
          }
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar2 + 0x278) = 0x8c9df7;
          local_110 = PlanningUnitMADPDiscrete::GetObservationHistoryIndex
                                (*(PlanningUnitMADPDiscrete **)((long)local_250 + lVar2 + 0x278),
                                 *(Index *)((long)local_250 + lVar2 + 0x274),
                                 *(Index *)((long)&local_258 + lVar2 + 0x278),
                                 *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                                  ((long)&local_260 + lVar2 + 0x278));
          sVar5 = bg.pn;
          p_Var1 = (bg.pn.pi_)->_vptr_sp_counted_base[0x13];
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar2 + 0x278) = 0x8c9e21;
          local_114 = (*p_Var1)(sVar5.pi_,(ulong)local_74,(ulong)(uint)tc);
          IVar4 = local_110;
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar2 + 0x278) = 0x8c9e5d;
          PlanningUnitMADPDiscrete::SoftPrintObservationHistory_abi_cxx11_
                    (&local_138,&pu->super_PlanningUnitMADPDiscrete,local_74,IVar4);
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar2 + 0x278) = 0x8c9e72;
          poVar14 = std::operator<<((ostream *)(ss + 0x10),(string *)&local_138);
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar2 + 0x278) = 0x8c9e8e;
          poVar14 = std::operator<<(poVar14," -> ");
          uVar15 = (ulong)local_114;
          p_Var1 = (pu->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[0xc];
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar2 + 0x278) = 0x8c9eb4;
          (*p_Var1)(local_158,pu,(ulong)local_74,uVar15);
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar2 + 0x278) = 0x8c9ec9;
          poVar14 = std::operator<<(poVar14,local_158);
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar2 + 0x278) = 0x8c9ee5;
          std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar2 + 0x278) = 0x8c9ef3;
          std::__cxx11::string::~string(local_158);
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar2 + 0x278) = 0x8c9eff;
          std::__cxx11::string::~string((string *)&local_138);
          IVar4 = local_110;
          uVar3 = local_114;
          if (ts + 1 <= last_ts) {
            in_stack_fffffffffffffd88 = pu;
            in_stack_fffffffffffffd90 = (BayesianGameWithClusterInfo *)ss;
            *(undefined8 *)(&stack0xfffffffffffffd80 + lVar2 + 0x278) = 0x8c9f9a;
            std::
            vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
            ::vector(*(vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
                       **)((long)local_228 + lVar2 + 0x280),
                     *(vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
                       **)((long)local_228 + lVar2 + 0x278));
            *(undefined1 **)((long)alStackY_290 + lVar2 + 0x280) = local_170;
            *(vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
              **)((long)alStackY_290 + lVar2 + 0x278) = jpolBGVec;
            *(uint *)((long)auStackY_2a0 + lVar2 + 0x280) = uVar3;
            *(uint *)((long)auStackY_2a0 + lVar2 + 0x278) = (uint)tc;
            *(TypeCluster **)((long)&uStackY_2a8 + lVar2 + 0x278) = pTVar12;
            *(Index *)((long)aIStackY_2b8 + lVar2 + 0x280) = IVar4;
            *(Index *)((long)aIStackY_2b8 + lVar2 + 0x278) = IVar9;
            *(undefined8 *)((long)&uStackY_2c0 + lVar2 + 0x278) = 0x8ca01d;
            RecursivelyPrintPolicyForAgent
                      (*(JointPolicyPureVectorForClusteredBG **)((long)&__vla_expr0 + lVar2 + 0x278)
                       ,*(PlanningUnitDecPOMDPDiscrete **)((long)&__vla_expr1 + lVar2 + 0x278),
                       *(stringstream **)((long)&observations + lVar2 + 0x288),
                       *(Index *)((long)&observations + lVar2 + 0x284),
                       *(Index *)((long)&observations + lVar2 + 0x280),
                       *(Index *)((long)&observations + lVar2 + 0x27c),
                       *(Index *)((long)&it + lVar2 + 0x278),*(Index *)((long)&tc + lVar2 + 0x278),
                       *(TypeCluster **)((long)&tI + lVar2 + 0x278),
                       *(Index *)((long)&IStack_78 + lVar2 + 0x278),
                       *(Index *)(local_70 + lVar2 + 0x278),
                       *(vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
                         **)((long)&bg + lVar2 + 0x278),
                       *(vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
                         **)((long)&bg + lVar2 + 0x280));
            *(undefined8 *)(&stack0xfffffffffffffd80 + lVar2 + 0x278) = 0x8ca02f;
            std::
            vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
            ::~vector(*(vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
                        **)((long)&local_260 + lVar2 + 0x278));
            in_stack_fffffffffffffd9c = local_74;
          }
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar2 + 0x278) = 0x8ca09b;
          std::_Rb_tree_const_iterator<Type_*>::operator++
                    (*(_Rb_tree_const_iterator<Type_*> **)((long)local_250 + lVar2 + 0x260),
                     *(int *)((long)local_250 + lVar2 + 0x25c));
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar2 + 0x278) = 0x8ca0ae;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                      ((long)&local_260 + lVar2 + 0x278));
        }
        else {
          std::_Rb_tree_const_iterator<Type_*>::operator++
                    ((_Rb_tree_const_iterator<Type_*> *)
                     CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                     (int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
        }
      }
      tc._0_4_ = (uint)tc + 1;
    }
    local_74 = local_74 + 1;
  }
  boost::shared_ptr<const_BayesianGameWithClusterInfo>::~shared_ptr
            ((shared_ptr<const_BayesianGameWithClusterInfo> *)0x8ca0f4);
  return;
}

Assistant:

void 
JointPolicyPureVectorForClusteredBG::StartRecursiveSoftPrintPerAgent( 
        const PlanningUnitDecPOMDPDiscrete* pu
        , stringstream& ss
        , Index ts
        , Index last_ts
        , const vector<const JointPolicyDiscretePure *>& jpolBGVec
        , vector<boost::shared_ptr<const BayesianGameWithClusterInfo> > bgVec
        )const 
{
    //const JointPolicyPureVectorForClusteredBG* jpolBG = jpolBGVec.at(ts);
    const JointPolicyDiscretePure*  jpolBG = jpolBGVec.at(ts);
    boost::shared_ptr<const BayesianGameWithClusterInfo> bg = bgVec.at(ts);
    for(Index agI=0; agI < pu->GetNrAgents(); agI++)
    {
        for(Index tI=0; tI < bg->GetNrTypes(agI); tI++)
        {
            const TypeCluster* tc =  bg->GetTypeCluster(agI, tI);
            TypeCluster::type_ci it = tc->begin();
            TypeCluster::type_ci last = tc->end();
            while(it != last)
            {
                Type* t1 = *it;
                if(t1->GetSubClass() != Type::AOHINDEX)
                {
                    //throw E("JointPolicyPureVectorForClusteredBG::StartRecursiveSoftPrintPerAgent - expected an AOHINDEX type");
                    it++;
                    continue;
                }
                Type_AOHIndex* t2 = dynamic_cast<Type_AOHIndex*>(t1);
                Index aohI = t2->GetAOHIndex();
                Index aIs[ts];
                Index oIs[ts];
                pu->GetActionObservationHistoryArrays (
                        agI, aohI, ts, aIs, oIs );
                vector<Index> observations;
                if(ts > 0)
                    observations = vector<Index>(oIs[0], oIs[ts-1]);
                Index ohI = pu->GetObservationHistoryIndex ( 
                        agI, ts, observations);
                Index aI = jpolBG->GetActionIndex(agI, tI);
                ss << pu->SoftPrintObservationHistory(agI, ohI) << " -> " <<
                    pu->SoftPrintAction(agI, aI) << endl;

                if(ts+1 <= last_ts)
                    RecursivelyPrintPolicyForAgent(
                        pu, ss, agI, ts+1, last_ts, aohI, 
                        ohI, tc, tI, aI, jpolBGVec, bgVec);
                it++;
            }
            
        }
    }

}